

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxQuicksort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
               (Breakpoint *keys,int end,BreakpointCompare *compare,int start,bool type)

{
  Breakpoint *pBVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  undefined8 uVar7;
  BreakpointSource BVar8;
  int32_t iVar9;
  fpclass_type fVar10;
  int32_t iVar11;
  int iVar12;
  BreakpointSource BVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int *piVar20;
  int start_00;
  ulong uVar21;
  long lVar22;
  Breakpoint *pBVar23;
  uint *puVar24;
  Breakpoint *pBVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  ulong uVar31;
  long lVar32;
  byte bVar33;
  type t;
  uint local_8e4;
  cpp_dec_float<200U,_int,_void> local_878;
  uint local_7f8 [30];
  uint local_780 [28];
  cpp_dec_float<200U,_int,_void> local_710;
  Breakpoint local_690;
  Breakpoint local_608;
  Breakpoint local_580;
  Breakpoint local_4f8;
  Breakpoint local_470;
  Breakpoint local_3e8;
  Breakpoint local_360;
  Breakpoint local_2d8;
  Breakpoint local_250;
  Breakpoint local_1c8;
  Breakpoint local_140;
  Breakpoint local_b8;
  ulong uVar30;
  
  bVar33 = 0;
  uVar21 = (ulong)(uint)start;
  if (start + 1 < end) {
    uVar27 = end - 1;
    uVar30 = (ulong)uVar27;
    uVar17 = uVar27 - start;
    if (0x18 < (int)uVar17) {
LAB_005cb670:
      local_7f8[0x18] = 0;
      local_7f8[0x19] = 0;
      local_7f8[0x1a] = 0;
      local_7f8[0x1b] = 0;
      local_7f8[0x14] = 0;
      local_7f8[0x15] = 0;
      local_7f8[0x16] = 0;
      local_7f8[0x17] = 0;
      local_7f8[0x10] = 0;
      local_7f8[0x11] = 0;
      local_7f8[0x12] = 0;
      local_7f8[0x13] = 0;
      local_7f8[0xc] = 0;
      local_7f8[0xd] = 0;
      local_7f8[0xe] = 0;
      local_7f8[0xf] = 0;
      local_7f8[8] = 0;
      local_7f8[9] = 0;
      local_7f8[10] = 0;
      local_7f8[0xb] = 0;
      local_7f8[4] = 0;
      local_7f8[5] = 0;
      local_7f8[6] = 0;
      local_7f8[7] = 0;
      local_7f8[0] = 0;
      local_7f8[1] = 0;
      local_7f8[2] = 0;
      local_7f8[3] = 0;
      start_00 = (int)uVar21;
      iVar18 = (uVar17 >> 1) + start_00;
      pBVar1 = keys + iVar18;
      pBVar23 = pBVar1;
      puVar24 = local_780;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar24 = (pBVar23->val).m_backend.data._M_elems[0];
        pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
        puVar24 = puVar24 + (ulong)bVar33 * -2 + 1;
      }
      iVar4 = keys[iVar18].val.m_backend.exp;
      bVar2 = keys[iVar18].val.m_backend.neg;
      fVar5 = keys[iVar18].val.m_backend.fpclass;
      iVar6 = keys[iVar18].val.m_backend.prec_elem;
      uVar7._0_4_ = keys[iVar18].idx;
      uVar7._4_4_ = keys[iVar18].src;
      lVar32 = (long)start_00;
      uVar27 = (uint)uVar30;
      lVar15 = (long)(int)uVar27;
      uVar26 = uVar21;
      uVar31 = uVar30;
      do {
        iVar18 = (int)uVar26;
        iVar28 = (int)uVar31;
        if ((type & 1U) == 0) {
          if (iVar18 < (int)uVar27) {
            piVar20 = &keys[iVar18].idx;
            do {
              pBVar23 = (Breakpoint *)(piVar20 + -0x20);
              pBVar25 = &local_1c8;
              for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
                (pBVar25->val).m_backend.data._M_elems[0] =
                     (pBVar23->val).m_backend.data._M_elems[0];
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
                pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar33 * -8 + 4);
              }
              local_1c8.val.m_backend.exp = piVar20[-4];
              local_1c8.val.m_backend.neg = *(bool *)(piVar20 + -3);
              local_1c8.val.m_backend._120_8_ = *(undefined8 *)(piVar20 + -2);
              local_1c8._128_8_ = *(undefined8 *)piVar20;
              puVar24 = local_780;
              pBVar23 = &local_4f8;
              for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
                (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
                puVar24 = puVar24 + (ulong)bVar33 * -2 + 1;
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
              }
              local_4f8.val.m_backend.exp = iVar4;
              local_4f8.val.m_backend.neg = bVar2;
              local_4f8.val.m_backend.fpclass = fVar5;
              local_4f8.val.m_backend.prec_elem = iVar6;
              local_4f8._128_8_ = uVar7;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_878,compare,&local_1c8,&local_4f8);
              if (local_878.fpclass == cpp_dec_float_NaN) goto LAB_005cbac8;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_710,0,(type *)0x0);
              iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_878,&local_710);
              if (0 < iVar18) goto LAB_005cbac8;
              uVar17 = (int)uVar26 + 1;
              uVar26 = (ulong)uVar17;
              piVar20 = piVar20 + 0x22;
            } while (uVar27 != uVar17);
            uVar26 = uVar30 & 0xffffffff;
          }
LAB_005cbac8:
          if (start_00 < iVar28) {
            local_8e4 = (uint)uVar26;
            uVar31 = (ulong)iVar28;
            piVar20 = &keys[uVar31].idx;
            do {
              pBVar23 = (Breakpoint *)(piVar20 + -0x20);
              pBVar25 = &local_250;
              for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
                (pBVar25->val).m_backend.data._M_elems[0] =
                     (pBVar23->val).m_backend.data._M_elems[0];
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
                pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar33 * -8 + 4);
              }
              local_250.val.m_backend.exp = piVar20[-4];
              local_250.val.m_backend.neg = *(bool *)(piVar20 + -3);
              local_250.val.m_backend._120_8_ = *(undefined8 *)(piVar20 + -2);
              local_250._128_8_ = *(undefined8 *)piVar20;
              puVar24 = local_780;
              pBVar23 = &local_580;
              for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
                (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
                puVar24 = puVar24 + (ulong)bVar33 * -2 + 1;
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
              }
              local_580.val.m_backend.exp = iVar4;
              local_580.val.m_backend.neg = bVar2;
              local_580.val.m_backend.fpclass = fVar5;
              local_580.val.m_backend.prec_elem = iVar6;
              local_580._128_8_ = uVar7;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_878,compare,&local_250,&local_580);
              if (local_878.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_710,0,(type *)0x0);
              iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_878,&local_710);
              if (iVar18 < 1) break;
              uVar31 = uVar31 - 1;
              piVar20 = piVar20 + -0x22;
            } while (lVar32 < (long)uVar31);
            goto LAB_005cbbd0;
          }
        }
        else {
          if (iVar18 < (int)uVar27) {
            piVar20 = &keys[iVar18].idx;
            lVar22 = 0;
            do {
              pBVar23 = (Breakpoint *)(piVar20 + -0x20);
              pBVar25 = &local_b8;
              for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
                (pBVar25->val).m_backend.data._M_elems[0] =
                     (pBVar23->val).m_backend.data._M_elems[0];
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
                pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar33 * -8 + 4);
              }
              local_b8.val.m_backend.exp = piVar20[-4];
              local_b8.val.m_backend.neg = *(bool *)(piVar20 + -3);
              local_b8.val.m_backend._120_8_ = *(undefined8 *)(piVar20 + -2);
              local_b8._128_8_ = *(undefined8 *)piVar20;
              puVar24 = local_780;
              pBVar23 = &local_3e8;
              for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
                (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
                puVar24 = puVar24 + (ulong)bVar33 * -2 + 1;
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
              }
              local_3e8.val.m_backend.exp = iVar4;
              local_3e8.val.m_backend.neg = bVar2;
              local_3e8.val.m_backend.fpclass = fVar5;
              local_3e8.val.m_backend.prec_elem = iVar6;
              local_3e8._128_8_ = uVar7;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_878,compare,&local_b8,&local_3e8);
              if (local_878.fpclass == cpp_dec_float_NaN) {
LAB_005cb98c:
                uVar26 = (ulong)(uint)(iVar18 - (int)lVar22);
                goto LAB_005cb9a3;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_710,0,(type *)0x0);
              iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_878,&local_710);
              if (-1 < iVar14) goto LAB_005cb98c;
              lVar22 = lVar22 + -1;
              piVar20 = piVar20 + 0x22;
            } while (iVar18 - lVar15 != lVar22);
            uVar26 = uVar30 & 0xffffffff;
          }
LAB_005cb9a3:
          if (start_00 < iVar28) {
            local_8e4 = (uint)uVar26;
            uVar31 = (ulong)iVar28;
            piVar20 = &keys[uVar31].idx;
            do {
              pBVar23 = (Breakpoint *)(piVar20 + -0x20);
              pBVar25 = &local_140;
              for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
                (pBVar25->val).m_backend.data._M_elems[0] =
                     (pBVar23->val).m_backend.data._M_elems[0];
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
                pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar33 * -8 + 4);
              }
              local_140.val.m_backend.exp = piVar20[-4];
              local_140.val.m_backend.neg = *(bool *)(piVar20 + -3);
              local_140.val.m_backend._120_8_ = *(undefined8 *)(piVar20 + -2);
              local_140._128_8_ = *(undefined8 *)piVar20;
              puVar24 = local_780;
              pBVar23 = &local_470;
              for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
                (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
                puVar24 = puVar24 + (ulong)bVar33 * -2 + 1;
                pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
              }
              local_470.val.m_backend.exp = iVar4;
              local_470.val.m_backend.neg = bVar2;
              local_470.val.m_backend.fpclass = fVar5;
              local_470.val.m_backend.prec_elem = iVar6;
              local_470._128_8_ = uVar7;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_878,compare,&local_140,&local_470);
              if (local_878.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_710,0,(type *)0x0);
              iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_878,&local_710);
              if (iVar18 < 0) break;
              uVar31 = uVar31 - 1;
              piVar20 = piVar20 + -0x22;
            } while (lVar32 < (long)uVar31);
LAB_005cbbd0:
            uVar26 = (ulong)local_8e4;
          }
        }
        iVar18 = (int)uVar26;
        iVar28 = (int)uVar31;
        if (iVar28 <= iVar18) goto LAB_005cbcb7;
        pBVar23 = keys + iVar18;
        puVar24 = local_7f8;
        for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
          *puVar24 = (pBVar23->val).m_backend.data._M_elems[0];
          pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
          puVar24 = puVar24 + (ulong)bVar33 * -2 + 1;
        }
        iVar14 = keys[iVar18].val.m_backend.exp;
        bVar3 = keys[iVar18].val.m_backend.neg;
        iVar12 = keys[iVar18].idx;
        BVar13 = keys[iVar18].src;
        pBVar23 = keys + iVar28;
        pBVar25 = keys + iVar18;
        for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
          (pBVar25->val).m_backend.data._M_elems[0] = (pBVar23->val).m_backend.data._M_elems[0];
          pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
          pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar33 * -8 + 4);
        }
        keys[iVar18].val.m_backend.exp = keys[iVar28].val.m_backend.exp;
        keys[iVar18].val.m_backend.neg = keys[iVar28].val.m_backend.neg;
        BVar8 = keys[iVar28].src;
        keys[iVar18].idx = keys[iVar28].idx;
        keys[iVar18].src = BVar8;
        puVar24 = local_7f8;
        pBVar23 = keys + iVar28;
        for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
          (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
          puVar24 = puVar24 + (ulong)bVar33 * -2 + 1;
          pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
        }
        keys[iVar28].val.m_backend.exp = iVar14;
        keys[iVar28].val.m_backend.neg = bVar3;
        fVar10 = keys[iVar18].val.m_backend.fpclass;
        iVar11 = keys[iVar18].val.m_backend.prec_elem;
        iVar9 = keys[iVar28].val.m_backend.prec_elem;
        keys[iVar18].val.m_backend.fpclass = keys[iVar28].val.m_backend.fpclass;
        keys[iVar18].val.m_backend.prec_elem = iVar9;
        keys[iVar28].val.m_backend.fpclass = fVar10;
        keys[iVar28].val.m_backend.prec_elem = iVar11;
        keys[iVar28].idx = iVar12;
        keys[iVar28].src = BVar13;
        uVar26 = (ulong)(iVar18 + 1);
        uVar31 = (ulong)(iVar28 - 1);
      } while( true );
    }
LAB_005cc104:
    if (0 < (int)uVar17) {
      SPxShellsort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                (keys,uVar27,compare,start);
    }
  }
  return;
LAB_005cbcb7:
  if ((type & 1U) == 0) {
    if (start_00 < iVar28) {
      uVar31 = (ulong)iVar28;
      piVar20 = &keys[uVar31].idx;
      do {
        puVar24 = local_780;
        pBVar23 = &local_690;
        for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
          (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
          puVar24 = puVar24 + (ulong)bVar33 * -2 + 1;
          pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
        }
        pBVar23 = (Breakpoint *)(piVar20 + -0x20);
        pBVar25 = &local_360;
        for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
          (pBVar25->val).m_backend.data._M_elems[0] = (pBVar23->val).m_backend.data._M_elems[0];
          pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
          pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar33 * -8 + 4);
        }
        local_360.val.m_backend.exp = piVar20[-4];
        local_360.val.m_backend.neg = *(bool *)(piVar20 + -3);
        local_360.val.m_backend._120_8_ = *(undefined8 *)(piVar20 + -2);
        local_360._128_8_ = *(undefined8 *)piVar20;
        local_690.val.m_backend.exp = iVar4;
        local_690.val.m_backend.neg = bVar2;
        local_690.val.m_backend.fpclass = fVar5;
        local_690.val.m_backend.prec_elem = iVar6;
        local_690._128_8_ = uVar7;
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::BreakpointCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_878,compare,&local_690,&local_360);
        if (local_878.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_710,0,(type *)0x0);
        iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_878,&local_710);
        if (0 < iVar18) break;
        uVar31 = uVar31 - 1;
        piVar20 = piVar20 + -0x22;
      } while (lVar32 < (long)uVar31);
    }
    if ((uint)uVar31 == uVar27) {
      pBVar23 = keys + lVar15;
      puVar24 = local_7f8;
      for (lVar32 = 0x1c; lVar32 != 0; lVar32 = lVar32 + -1) {
        *puVar24 = (pBVar23->val).m_backend.data._M_elems[0];
        pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
        puVar24 = puVar24 + (ulong)bVar33 * -2 + 1;
      }
      iVar18 = keys[lVar15].val.m_backend.exp;
      bVar2 = keys[lVar15].val.m_backend.neg;
      iVar4 = keys[lVar15].idx;
      BVar13 = keys[lVar15].src;
      pBVar23 = pBVar1;
      pBVar25 = keys + lVar15;
      for (lVar32 = 0x1c; lVar32 != 0; lVar32 = lVar32 + -1) {
        (pBVar25->val).m_backend.data._M_elems[0] = (pBVar23->val).m_backend.data._M_elems[0];
        pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
        pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar33 * -8 + 4);
      }
      keys[lVar15].val.m_backend.exp = (pBVar1->val).m_backend.exp;
      keys[lVar15].val.m_backend.neg = (pBVar1->val).m_backend.neg;
      BVar8 = pBVar1->src;
      keys[lVar15].idx = pBVar1->idx;
      keys[lVar15].src = BVar8;
      puVar24 = local_7f8;
      pBVar23 = pBVar1;
      for (lVar32 = 0x1c; lVar32 != 0; lVar32 = lVar32 + -1) {
        (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
        puVar24 = puVar24 + (ulong)bVar33 * -2 + 1;
        pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
      }
      (pBVar1->val).m_backend.exp = iVar18;
      (pBVar1->val).m_backend.neg = bVar2;
      fVar5 = keys[lVar15].val.m_backend.fpclass;
      iVar9 = keys[lVar15].val.m_backend.prec_elem;
      iVar6 = (pBVar1->val).m_backend.prec_elem;
      keys[lVar15].val.m_backend.fpclass = (pBVar1->val).m_backend.fpclass;
      keys[lVar15].val.m_backend.prec_elem = iVar6;
      (pBVar1->val).m_backend.fpclass = fVar5;
      (pBVar1->val).m_backend.prec_elem = iVar9;
      pBVar1->idx = iVar4;
      pBVar1->src = BVar13;
      uVar31 = (ulong)(uVar27 - 1);
    }
  }
  else {
    if (iVar18 < (int)uVar27) {
      piVar20 = &keys[iVar18].idx;
      do {
        puVar24 = local_780;
        pBVar23 = &local_608;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
          puVar24 = puVar24 + (ulong)bVar33 * -2 + 1;
          pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
        }
        pBVar23 = (Breakpoint *)(piVar20 + -0x20);
        pBVar25 = &local_2d8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pBVar25->val).m_backend.data._M_elems[0] = (pBVar23->val).m_backend.data._M_elems[0];
          pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
          pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar33 * -8 + 4);
        }
        local_2d8.val.m_backend.exp = piVar20[-4];
        local_2d8.val.m_backend.neg = *(bool *)(piVar20 + -3);
        local_2d8.val.m_backend._120_8_ = *(undefined8 *)(piVar20 + -2);
        local_2d8._128_8_ = *(undefined8 *)piVar20;
        local_608.val.m_backend.exp = iVar4;
        local_608.val.m_backend.neg = bVar2;
        local_608.val.m_backend.fpclass = fVar5;
        local_608.val.m_backend.prec_elem = iVar6;
        local_608._128_8_ = uVar7;
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::BreakpointCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_878,compare,&local_608,&local_2d8);
        if (local_878.fpclass == cpp_dec_float_NaN) goto LAB_005cbf1d;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_710,0,(type *)0x0);
        iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_878,&local_710);
        if (iVar18 < 0) goto LAB_005cbf1d;
        uVar17 = (int)uVar26 + 1;
        uVar26 = (ulong)uVar17;
        piVar20 = piVar20 + 0x22;
      } while (uVar27 != uVar17);
      uVar26 = uVar30 & 0xffffffff;
    }
LAB_005cbf1d:
    if ((int)uVar26 == start_00) {
      pBVar23 = keys + lVar32;
      puVar24 = local_7f8;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar24 = (pBVar23->val).m_backend.data._M_elems[0];
        pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
        puVar24 = puVar24 + (ulong)bVar33 * -2 + 1;
      }
      iVar18 = keys[lVar32].val.m_backend.exp;
      bVar2 = keys[lVar32].val.m_backend.neg;
      iVar4 = keys[lVar32].idx;
      BVar13 = keys[lVar32].src;
      pBVar23 = pBVar1;
      pBVar25 = keys + lVar32;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pBVar25->val).m_backend.data._M_elems[0] = (pBVar23->val).m_backend.data._M_elems[0];
        pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
        pBVar25 = (Breakpoint *)((long)pBVar25 + (ulong)bVar33 * -8 + 4);
      }
      keys[lVar32].val.m_backend.exp = (pBVar1->val).m_backend.exp;
      keys[lVar32].val.m_backend.neg = (pBVar1->val).m_backend.neg;
      BVar8 = pBVar1->src;
      keys[lVar32].idx = pBVar1->idx;
      keys[lVar32].src = BVar8;
      puVar24 = local_7f8;
      pBVar23 = pBVar1;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pBVar23->val).m_backend.data._M_elems[0] = *puVar24;
        puVar24 = puVar24 + (ulong)bVar33 * -2 + 1;
        pBVar23 = (Breakpoint *)((long)pBVar23 + (ulong)bVar33 * -8 + 4);
      }
      (pBVar1->val).m_backend.exp = iVar18;
      (pBVar1->val).m_backend.neg = bVar2;
      fVar5 = keys[lVar32].val.m_backend.fpclass;
      iVar9 = keys[lVar32].val.m_backend.prec_elem;
      iVar6 = (pBVar1->val).m_backend.prec_elem;
      keys[lVar32].val.m_backend.fpclass = (pBVar1->val).m_backend.fpclass;
      keys[lVar32].val.m_backend.prec_elem = iVar6;
      (pBVar1->val).m_backend.fpclass = fVar5;
      (pBVar1->val).m_backend.prec_elem = iVar9;
      pBVar1->idx = iVar4;
      pBVar1->src = BVar13;
      uVar26 = (ulong)(start_00 + 1);
    }
  }
  uVar29 = (uint)uVar31;
  uVar17 = uVar29 - start_00;
  iVar18 = (int)uVar26;
  uVar19 = uVar27 - iVar18;
  if ((int)uVar19 < (int)uVar17) {
    uVar26 = uVar21;
    uVar30 = uVar31;
    uVar19 = uVar17;
    uVar29 = uVar27;
    start_00 = iVar18;
    if ((int)uVar27 <= iVar18) goto LAB_005cc0e9;
  }
  else {
    uVar21 = uVar26;
    uVar31 = uVar30;
    uVar17 = uVar19;
    if ((int)uVar29 <= start_00) goto LAB_005cc0e9;
  }
  SPxQuicksort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
            (keys,uVar29 + 1,compare,start_00,(bool)(~type & 1));
  uVar21 = uVar26;
  uVar31 = uVar30;
  uVar17 = uVar19;
LAB_005cc0e9:
  uVar27 = (uint)uVar31;
  start = (int)uVar21;
  type = (bool)(type ^ 1);
  uVar30 = uVar31;
  if ((int)uVar17 < 0x19) goto LAB_005cc104;
  goto LAB_005cb670;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}